

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * google::protobuf::compiler::ruby::LabelForField_abi_cxx11_(FieldDescriptor *field)

{
  Label LVar1;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  LVar1 = FieldDescriptor::label(in_RSI);
  if (LVar1 == LABEL_OPTIONAL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"optional",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else if (LVar1 == LABEL_REQUIRED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"required",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (LVar1 == LABEL_REPEATED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"repeated",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

std::string LabelForField(const FieldDescriptor* field) {
  switch (field->label()) {
    case FieldDescriptor::LABEL_OPTIONAL: return "optional";
    case FieldDescriptor::LABEL_REQUIRED: return "required";
    case FieldDescriptor::LABEL_REPEATED: return "repeated";
    default: assert(false); return "";
  }
}